

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_assertion_tests.cpp
# Opt level: O2

void __thiscall
string_assertion_test::iu_StrTest_x_iutest_x_EqString_Test<char16_t>::Body
          (iu_StrTest_x_iutest_x_EqString_Test<char16_t> *this)

{
  undefined *puVar1;
  AssertionResult iutest_ar;
  iuCodeMessage local_380;
  String test2;
  String test1;
  u16string local_310 [32];
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> local_2f0;
  u16string local_2d0 [32];
  u16string local_2b0 [32];
  u16string local_290 [32];
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> local_270;
  u16string local_250 [32];
  u16string local_230 [32];
  u16string local_210 [32];
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> local_1f0;
  u16string local_1d0 [32];
  u16string local_1b0 [32];
  Fixed local_190;
  
  std::__cxx11::u16string::u16string<std::allocator<char16_t>>
            ((u16string *)&test1,(char16_t *)text<char16_t>::test,(allocator<char16_t> *)&local_190)
  ;
  std::__cxx11::u16string::u16string<std::allocator<char16_t>>
            ((u16string *)&test2,(char16_t *)text<char16_t>::test,(allocator<char16_t> *)&local_190)
  ;
  std::__cxx11::u16string::u16string(local_1b0,&test1);
  iutest::internal::CmpHelperSTREQ<std::__cxx11::u16string,char16_t_const*>
            (&iutest_ar,(internal *)"test1","TestFixture::Text::test",(char *)local_1b0,
             (basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *)
             text<char16_t>::test,(char16_t *)&iutest_type_traits::enabler_t<void>::value,
             (type **)iutest_ar.m_message._M_dataplus._M_p);
  std::__cxx11::u16string::~u16string(local_1b0);
  if (iutest_ar.m_result == false) {
    memset(&local_190,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_380,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
               ,0x76,iutest_ar.m_message._M_dataplus._M_p);
    local_380._44_4_ = 0xffffffff;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_380,&local_190);
    std::__cxx11::string::~string((string *)&local_380);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  std::__cxx11::u16string::u16string(local_1d0,&test1);
  std::__cxx11::u16string::u16string((u16string *)&local_1f0,&test2);
  iutest::internal::CmpHelperSTREQ<std::__cxx11::u16string,std::__cxx11::u16string>
            (&iutest_ar,(internal *)"test1","test2",(char *)local_1d0,&local_1f0,
             (basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *)
             &iutest_type_traits::enabler_t<void>::value,
             (type **)iutest_ar.m_message._M_dataplus._M_p);
  std::__cxx11::u16string::~u16string((u16string *)&local_1f0);
  std::__cxx11::u16string::~u16string(local_1d0);
  if (iutest_ar.m_result == false) {
    memset(&local_190,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_380,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
               ,0x77,iutest_ar.m_message._M_dataplus._M_p);
    local_380._44_4_ = 0xffffffff;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_380,&local_190);
    std::__cxx11::string::~string((string *)&local_380);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  puVar1 = text<char16_t>::test;
  std::__cxx11::u16string::u16string(local_210,&test2);
  iutest::internal::CmpHelperSTREQ<char16_t_const*,std::__cxx11::u16string>
            (&iutest_ar,(internal *)"TestFixture::Text::test","test2",puVar1,(char16_t *)local_210,
             (basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *)
             &iutest_type_traits::enabler_t<void>::value,
             (type **)iutest_ar.m_message._M_dataplus._M_p);
  std::__cxx11::u16string::~u16string(local_210);
  if (iutest_ar.m_result == false) {
    memset(&local_190,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_380,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
               ,0x78,iutest_ar.m_message._M_dataplus._M_p);
    local_380._44_4_ = 0xffffffff;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_380,&local_190);
    std::__cxx11::string::~string((string *)&local_380);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  std::__cxx11::u16string::u16string(local_230,&test1);
  iutest::internal::CmpHelperSTREQ<std::__cxx11::u16string,char16_t_const*>
            (&iutest_ar,(internal *)"test1","TestFixture::Text::test",(char *)local_230,
             (basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *)
             text<char16_t>::test,(char16_t *)&iutest_type_traits::enabler_t<void>::value,
             (type **)iutest_ar.m_message._M_dataplus._M_p);
  std::__cxx11::u16string::~u16string(local_230);
  if (iutest_ar.m_result == false) {
    memset(&local_190,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_380,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
               ,0x7a,iutest_ar.m_message._M_dataplus._M_p);
    local_380._44_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_380,&local_190);
    std::__cxx11::string::~string((string *)&local_380);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  std::__cxx11::u16string::u16string(local_250,&test1);
  std::__cxx11::u16string::u16string((u16string *)&local_270,&test2);
  iutest::internal::CmpHelperSTREQ<std::__cxx11::u16string,std::__cxx11::u16string>
            (&iutest_ar,(internal *)"test1","test2",(char *)local_250,&local_270,
             (basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *)
             &iutest_type_traits::enabler_t<void>::value,
             (type **)iutest_ar.m_message._M_dataplus._M_p);
  std::__cxx11::u16string::~u16string((u16string *)&local_270);
  std::__cxx11::u16string::~u16string(local_250);
  if (iutest_ar.m_result == false) {
    memset(&local_190,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_380,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
               ,0x7b,iutest_ar.m_message._M_dataplus._M_p);
    local_380._44_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_380,&local_190);
    std::__cxx11::string::~string((string *)&local_380);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  puVar1 = text<char16_t>::test;
  std::__cxx11::u16string::u16string(local_290,&test2);
  iutest::internal::CmpHelperSTREQ<char16_t_const*,std::__cxx11::u16string>
            (&iutest_ar,(internal *)"TestFixture::Text::test","test2",puVar1,(char16_t *)local_290,
             (basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *)
             &iutest_type_traits::enabler_t<void>::value,
             (type **)iutest_ar.m_message._M_dataplus._M_p);
  std::__cxx11::u16string::~u16string(local_290);
  if (iutest_ar.m_result == false) {
    memset(&local_190,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_380,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
               ,0x7c,iutest_ar.m_message._M_dataplus._M_p);
    local_380._44_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_380,&local_190);
    std::__cxx11::string::~string((string *)&local_380);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  std::__cxx11::u16string::u16string(local_2b0,&test1);
  iutest::internal::CmpHelperSTREQ<std::__cxx11::u16string,char16_t_const*>
            (&iutest_ar,(internal *)"test1","TestFixture::Text::test",(char *)local_2b0,
             (basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *)
             text<char16_t>::test,(char16_t *)&iutest_type_traits::enabler_t<void>::value,
             (type **)iutest_ar.m_message._M_dataplus._M_p);
  std::__cxx11::u16string::~u16string(local_2b0);
  if (iutest_ar.m_result == false) {
    memset(&local_190,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_380,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
               ,0x7e,iutest_ar.m_message._M_dataplus._M_p);
    local_380._44_4_ = 2;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_380,&local_190);
  }
  else {
    std::__cxx11::string::~string((string *)&iutest_ar);
    std::__cxx11::u16string::u16string(local_2d0,&test1);
    std::__cxx11::u16string::u16string((u16string *)&local_2f0,&test2);
    iutest::internal::CmpHelperSTREQ<std::__cxx11::u16string,std::__cxx11::u16string>
              (&iutest_ar,(internal *)"test1","test2",(char *)local_2d0,&local_2f0,
               (basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *)
               &iutest_type_traits::enabler_t<void>::value,
               (type **)iutest_ar.m_message._M_dataplus._M_p);
    std::__cxx11::u16string::~u16string((u16string *)&local_2f0);
    std::__cxx11::u16string::~u16string(local_2d0);
    if (iutest_ar.m_result == false) {
      memset(&local_190,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)&local_190);
      iutest::detail::iuCodeMessage::iuCodeMessage
                (&local_380,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
                 ,0x7f,iutest_ar.m_message._M_dataplus._M_p);
      local_380._44_4_ = 2;
      iutest::AssertionHelper::operator=((AssertionHelper *)&local_380,&local_190);
    }
    else {
      std::__cxx11::string::~string((string *)&iutest_ar);
      puVar1 = text<char16_t>::test;
      std::__cxx11::u16string::u16string(local_310,&test2);
      iutest::internal::CmpHelperSTREQ<char16_t_const*,std::__cxx11::u16string>
                (&iutest_ar,(internal *)"TestFixture::Text::test","test2",puVar1,
                 (char16_t *)local_310,
                 (basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *)
                 &iutest_type_traits::enabler_t<void>::value,
                 (type **)iutest_ar.m_message._M_dataplus._M_p);
      std::__cxx11::u16string::~u16string(local_310);
      if (iutest_ar.m_result != false) goto LAB_002cb994;
      memset(&local_190,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)&local_190);
      iutest::detail::iuCodeMessage::iuCodeMessage
                (&local_380,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
                 ,0x80,iutest_ar.m_message._M_dataplus._M_p);
      local_380._44_4_ = 2;
      iutest::AssertionHelper::operator=((AssertionHelper *)&local_380,&local_190);
    }
  }
  std::__cxx11::string::~string((string *)&local_380);
  iutest::iu_global_format_stringstream::~iu_global_format_stringstream
            ((iu_global_format_stringstream *)&local_190);
LAB_002cb994:
  std::__cxx11::string::~string((string *)&iutest_ar);
  std::__cxx11::u16string::~u16string((u16string *)&test2);
  std::__cxx11::u16string::~u16string((u16string *)&test1);
  return;
}

Assistant:

IUTEST_TYPED_TEST(StrTest, EqString)
{
    typename TestFixture::String test1 = TestFixture::Text::test;
    typename TestFixture::String test2 = TestFixture::Text::test;
    IUTEST_INFORM_STREQ(test1, TestFixture::Text::test);
    IUTEST_INFORM_STREQ(test1, test2);
    IUTEST_INFORM_STREQ(TestFixture::Text::test, test2);

    IUTEST_EXPECT_STREQ(test1, TestFixture::Text::test);
    IUTEST_EXPECT_STREQ(test1, test2);
    IUTEST_EXPECT_STREQ(TestFixture::Text::test, test2);

    IUTEST_ASSERT_STREQ(test1, TestFixture::Text::test);
    IUTEST_ASSERT_STREQ(test1, test2);
    IUTEST_ASSERT_STREQ(TestFixture::Text::test, test2);
}